

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DisableIffAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::DisableIffAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&>
          (BumpAllocator *this,Expression *args,AssertionExpr *args_1)

{
  DisableIffAssertionExpr *pDVar1;
  
  pDVar1 = (DisableIffAssertionExpr *)allocate(this,0x20,8);
  (pDVar1->super_AssertionExpr).kind = DisableIff;
  (pDVar1->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pDVar1->condition = args;
  pDVar1->expr = args_1;
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }